

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metablock.cc
# Opt level: O0

void __thiscall
brotli::BlockSplitter<brotli::Histogram<704>_>::BlockSplitter
          (BlockSplitter<brotli::Histogram<704>_> *this,size_t alphabet_size,size_t min_block_size,
          double split_threshold,size_t num_symbols,BlockSplit *split,
          vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_> *histograms)

{
  unsigned_long *puVar1;
  unsigned_long local_58;
  unsigned_long local_50;
  size_t max_num_types;
  size_t max_num_blocks;
  vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_> *histograms_local;
  BlockSplit *split_local;
  size_t num_symbols_local;
  double split_threshold_local;
  size_t min_block_size_local;
  size_t alphabet_size_local;
  BlockSplitter<brotli::Histogram<704>_> *this_local;
  
  this->alphabet_size_ = alphabet_size;
  this->min_block_size_ = min_block_size;
  this->split_threshold_ = split_threshold;
  this->num_blocks_ = 0;
  this->split_ = split;
  this->histograms_ = histograms;
  this->target_block_size_ = min_block_size;
  this->block_size_ = 0;
  this->curr_histogram_ix_ = 0;
  this->merge_last_count_ = 0;
  max_num_types = num_symbols / min_block_size + 1;
  local_58 = 0x101;
  max_num_blocks = (size_t)histograms;
  histograms_local =
       (vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_> *)split;
  split_local = (BlockSplit *)num_symbols;
  num_symbols_local = (size_t)split_threshold;
  split_threshold_local = (double)min_block_size;
  min_block_size_local = alphabet_size;
  alphabet_size_local = (size_t)this;
  puVar1 = std::min<unsigned_long>(&max_num_types,&local_58);
  local_50 = *puVar1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&this->split_->lengths,max_num_types);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->split_->types,max_num_types);
  std::vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>::resize
            (this->histograms_,local_50);
  this->last_histogram_ix_[1] = 0;
  this->last_histogram_ix_[0] = 0;
  return;
}

Assistant:

BlockSplitter(size_t alphabet_size,
                size_t min_block_size,
                double split_threshold,
                size_t num_symbols,
                BlockSplit* split,
                std::vector<HistogramType>* histograms)
      : alphabet_size_(alphabet_size),
        min_block_size_(min_block_size),
        split_threshold_(split_threshold),
        num_blocks_(0),
        split_(split),
        histograms_(histograms),
        target_block_size_(min_block_size),
        block_size_(0),
        curr_histogram_ix_(0),
        merge_last_count_(0) {
    size_t max_num_blocks = num_symbols / min_block_size + 1;
    // We have to allocate one more histogram than the maximum number of block
    // types for the current histogram when the meta-block is too big.
    size_t max_num_types = std::min<size_t>(max_num_blocks, kMaxBlockTypes + 1);
    split_->lengths.resize(max_num_blocks);
    split_->types.resize(max_num_blocks);
    histograms_->resize(max_num_types);
    last_histogram_ix_[0] = last_histogram_ix_[1] = 0;
  }